

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorProto::MergeFrom
          (FileDescriptorProto *this,FileDescriptorProto *from)

{
  uint uVar1;
  FileDescriptorProto *pFVar2;
  string *psVar3;
  LogMessage *other;
  uint32_t *puVar4;
  Arena *pAVar5;
  FileOptions *this_00;
  FileOptions *from_00;
  SourceCodeInfo *this_01;
  SourceCodeInfo *from_01;
  LogFinisher local_95;
  uint32_t cached_has_bits;
  byte local_81;
  LogMessage local_80;
  FileDescriptorProto *local_48;
  FileDescriptorProto *from_local;
  FileDescriptorProto *this_local;
  FileDescriptorProto *local_30;
  string *local_28;
  FileDescriptorProto *local_20;
  string *local_18;
  FileDescriptorProto *local_10;
  
  local_81 = 0;
  local_48 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x7fc);
    local_81 = 1;
    other = internal::LogMessage::operator<<(&local_80,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_95,other);
  }
  if ((local_81 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_80);
  }
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&this->dependency_,&local_48->dependency_);
  RepeatedPtrField<google::protobuf::DescriptorProto>::MergeFrom
            (&this->message_type_,&local_48->message_type_);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::MergeFrom
            (&this->enum_type_,&local_48->enum_type_);
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::MergeFrom
            (&this->service_,&local_48->service_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::MergeFrom
            (&this->extension_,&local_48->extension_);
  RepeatedField<int>::MergeFrom(&this->public_dependency_,&local_48->public_dependency_);
  RepeatedField<int>::MergeFrom(&this->weak_dependency_,&local_48->weak_dependency_);
  puVar4 = internal::HasBits<1UL>::operator[](&local_48->_has_bits_,0);
  uVar1 = *puVar4;
  if ((uVar1 & 0x1f) != 0) {
    if ((uVar1 & 1) != 0) {
      this_local = (FileDescriptorProto *)_internal_name_abi_cxx11_(local_48);
      local_30 = this;
      puVar4 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
      pFVar2 = this_local;
      *puVar4 = *puVar4 | 1;
      pAVar5 = MessageLite::GetArenaForAllocation((MessageLite *)this);
      internal::ArenaStringPtr::Set(&this->name_,pFVar2,pAVar5);
    }
    if ((uVar1 & 2) != 0) {
      local_28 = _internal_package_abi_cxx11_(local_48);
      local_20 = this;
      puVar4 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
      psVar3 = local_28;
      *puVar4 = *puVar4 | 2;
      pAVar5 = MessageLite::GetArenaForAllocation((MessageLite *)this);
      internal::ArenaStringPtr::Set(&this->package_,psVar3,pAVar5);
    }
    if ((uVar1 & 4) != 0) {
      local_18 = _internal_syntax_abi_cxx11_(local_48);
      local_10 = this;
      puVar4 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
      psVar3 = local_18;
      *puVar4 = *puVar4 | 4;
      pAVar5 = MessageLite::GetArenaForAllocation((MessageLite *)this);
      internal::ArenaStringPtr::Set(&this->syntax_,psVar3,pAVar5);
    }
    if ((uVar1 & 8) != 0) {
      this_00 = _internal_mutable_options(this);
      from_00 = _internal_options(local_48);
      FileOptions::MergeFrom(this_00,from_00);
    }
    if ((uVar1 & 0x10) != 0) {
      this_01 = _internal_mutable_source_code_info(this);
      from_01 = _internal_source_code_info(local_48);
      SourceCodeInfo::MergeFrom(this_01,from_01);
    }
  }
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_,
             &(local_48->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

void FileDescriptorProto::MergeFrom(const FileDescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FileDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  dependency_.MergeFrom(from.dependency_);
  message_type_.MergeFrom(from.message_type_);
  enum_type_.MergeFrom(from.enum_type_);
  service_.MergeFrom(from.service_);
  extension_.MergeFrom(from.extension_);
  public_dependency_.MergeFrom(from.public_dependency_);
  weak_dependency_.MergeFrom(from.weak_dependency_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x0000001fu) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_name(from._internal_name());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_package(from._internal_package());
    }
    if (cached_has_bits & 0x00000004u) {
      _internal_set_syntax(from._internal_syntax());
    }
    if (cached_has_bits & 0x00000008u) {
      _internal_mutable_options()->::PROTOBUF_NAMESPACE_ID::FileOptions::MergeFrom(from._internal_options());
    }
    if (cached_has_bits & 0x00000010u) {
      _internal_mutable_source_code_info()->::PROTOBUF_NAMESPACE_ID::SourceCodeInfo::MergeFrom(from._internal_source_code_info());
    }
  }
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
}